

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_getMTCtxParameter(ZSTDMT_CCtx *mtctx,ZSTDMT_parameter parameter,int *value)

{
  int iVar1;
  size_t sVar2;
  
  if (parameter == ZSTDMT_p_rsyncable) {
    iVar1 = (mtctx->params).rsyncable;
  }
  else {
    if (parameter != ZSTDMT_p_overlapLog) {
      if (parameter == ZSTDMT_p_jobSize) {
        sVar2 = ZSTD_CCtxParams_getParameter(&mtctx->params,ZSTD_c_jobSize,value);
        return sVar2;
      }
      return 0xffffffffffffffd8;
    }
    iVar1 = (mtctx->params).overlapLog;
  }
  *value = iVar1;
  return 0;
}

Assistant:

size_t ZSTDMT_getMTCtxParameter(ZSTDMT_CCtx* mtctx, ZSTDMT_parameter parameter, int* value)
{
    switch (parameter) {
    case ZSTDMT_p_jobSize:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_jobSize, value);
    case ZSTDMT_p_overlapLog:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_overlapLog, value);
    case ZSTDMT_p_rsyncable:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_rsyncable, value);
    default:
        return ERROR(parameter_unsupported);
    }
}